

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O1

int Cnf_CutSuperAreaFlow(Vec_Ptr_t *vSuper,int *pAreaFlows)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = vSuper->nSize;
  iVar4 = iVar1 * 100 + 100;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      uVar3 = (ulong)vSuper->pArray[lVar5] & 0xfffffffffffffffe;
      uVar2 = *(uint *)(uVar3 + 0x18);
      if (0xfffffffd < (uVar2 & 7) - 7) {
        if (uVar2 < 0x40) {
          __assert_fail("pLeaf->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfMap.c"
                        ,0x53,"int Cnf_CutSuperAreaFlow(Vec_Ptr_t *, int *)");
        }
        iVar4 = iVar4 + pAreaFlows[*(int *)(uVar3 + 0x24)] / (int)(uVar2 >> 6);
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return iVar4;
}

Assistant:

int Cnf_CutSuperAreaFlow( Vec_Ptr_t * vSuper, int * pAreaFlows )
{
    Aig_Obj_t * pLeaf;
    int i, nAreaFlow;
    nAreaFlow = 100 * (Vec_PtrSize(vSuper) + 1);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
    {
        pLeaf = Aig_Regular(pLeaf);
        if ( !Aig_ObjIsNode(pLeaf) )
            continue;
        assert( pLeaf->nRefs > 0 );
        nAreaFlow += pAreaFlows[pLeaf->Id] / (pLeaf->nRefs? pLeaf->nRefs : 1);
    }
    return nAreaFlow;
}